

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O2

ProgramSources *
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateProgramSources
          (ProgramSources *__return_storage_ptr__,NegativeTestContext *ctx,BlendEquation equation)

{
  bool bVar1;
  ContextType CVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [40];
  undefined1 local_290 [40];
  ostringstream source;
  ProgramSources local_f0;
  
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&source,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main ()\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tgl_Position = vec4(0.0);\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  glu::VertexSource::VertexSource((VertexSource *)local_290,&local_2d8);
  pPVar5 = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)local_290);
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&source,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  pcVar3 = "#extension GL_KHR_blend_equation_advanced : enable\n";
  if (bVar1) {
    pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,"layout(");
  switch(equation) {
  case BLEND_EQUATION_MULTIPLY:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_multiply",&local_319);
    break;
  case BLEND_EQUATION_SCREEN:
    std::__cxx11::string::string<std::allocator<char>>(local_318,"blend_support_screen",&local_319);
    break;
  case BLEND_EQUATION_OVERLAY:
    std::__cxx11::string::string<std::allocator<char>>(local_318,"blend_support_overlay",&local_319)
    ;
    break;
  case BLEND_EQUATION_DARKEN:
    std::__cxx11::string::string<std::allocator<char>>(local_318,"blend_support_darken",&local_319);
    break;
  case BLEND_EQUATION_LIGHTEN:
    std::__cxx11::string::string<std::allocator<char>>(local_318,"blend_support_lighten",&local_319)
    ;
    break;
  case BLEND_EQUATION_COLORDODGE:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_colordodge",&local_319);
    break;
  case BLEND_EQUATION_COLORBURN:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_colorburn",&local_319);
    break;
  case BLEND_EQUATION_HARDLIGHT:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_hardlight",&local_319);
    break;
  case BLEND_EQUATION_SOFTLIGHT:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_softlight",&local_319);
    break;
  case BLEND_EQUATION_DIFFERENCE:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_difference",&local_319);
    break;
  case BLEND_EQUATION_EXCLUSION:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_exclusion",&local_319);
    break;
  case BLEND_EQUATION_HSL_HUE:
    std::__cxx11::string::string<std::allocator<char>>(local_318,"blend_support_hsl_hue",&local_319)
    ;
    break;
  case BLEND_EQUATION_HSL_SATURATION:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_hsl_saturation",&local_319);
    break;
  case BLEND_EQUATION_HSL_COLOR:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_hsl_color",&local_319);
    break;
  case BLEND_EQUATION_HSL_LUMINOSITY:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_hsl_luminosity",&local_319);
    break;
  case BLEND_EQUATION_ALL_EQUATIONS:
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"blend_support_all_equations",&local_319);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>(local_318,(char *)0x0,&local_319);
  }
  poVar4 = std::operator<<(poVar4,local_318);
  poVar4 = std::operator<<(poVar4,") out;\n");
  poVar4 = std::operator<<(poVar4,"layout(location=0) out mediump vec4 o_color;\n");
  poVar4 = std::operator<<(poVar4,"void main ()\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\to_color = vec4(0);\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string(local_318);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2b8,&local_2f8);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_2b8);
  glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar5);
  std::__cxx11::string::~string((string *)(local_2b8 + 8));
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)(local_290 + 8));
  std::__cxx11::string::~string((string *)&local_2d8);
  glu::ProgramSources::~ProgramSources(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

glu::ProgramSources generateProgramSources (NegativeTestContext& ctx, BlendEquation equation)
{
	return glu::ProgramSources()
		<< glu::VertexSource(generateVertexShaderSource(ctx))
		<< glu::FragmentSource(generateFragmentShaderSource(ctx, equation));
}